

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

uchar * rlReadScreenPixels(int width,int height)

{
  void *__ptr;
  uchar *puVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  
  uVar7 = width * 4;
  __ptr = calloc((long)(int)(uVar7 * height),1);
  iVar6 = 0;
  (*glad_glReadPixels)(0,0,width,height,0x1908,0x1401,__ptr);
  puVar1 = (uchar *)malloc((long)(int)(uVar7 * height));
  uVar2 = 0;
  if (0 < (int)uVar7) {
    uVar2 = (ulong)uVar7;
  }
  iVar4 = (height + -1) * width * 4;
  for (lVar3 = (long)(height + -1); -1 < lVar3; lVar3 = lVar3 + -1) {
    for (uVar5 = 1; uVar5 - uVar2 != 1; uVar5 = uVar5 + 1) {
      puVar1[uVar5 + (long)iVar6 + -1] =
           -((uVar5 & 3) == 0) | *(byte *)((long)__ptr + uVar5 + (long)iVar4 + -1);
    }
    iVar6 = iVar6 + uVar7;
    iVar4 = iVar4 + width * -4;
  }
  free(__ptr);
  return puVar1;
}

Assistant:

unsigned char *rlReadScreenPixels(int width, int height)
{
    unsigned char *screenData = (unsigned char *)RL_CALLOC(width*height*4, sizeof(unsigned char));

    // NOTE 1: glReadPixels returns image flipped vertically -> (0,0) is the bottom left corner of the framebuffer
    // NOTE 2: We are getting alpha channel! Be careful, it can be transparent if not cleared properly!
    glReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, screenData);

    // Flip image vertically!
    unsigned char *imgData = (unsigned char *)RL_MALLOC(width*height*4*sizeof(unsigned char));

    for (int y = height - 1; y >= 0; y--)
    {
        for (int x = 0; x < (width*4); x++)
        {
            imgData[((height - 1) - y)*width*4 + x] = screenData[(y*width*4) + x];  // Flip line

            // Set alpha component value to 255 (no trasparent image retrieval)
            // NOTE: Alpha value has already been applied to RGB in framebuffer, we don't need it!
            if (((x + 1)%4) == 0) imgData[((height - 1) - y)*width*4 + x] = 255;
        }
    }

    RL_FREE(screenData);

    return imgData;     // NOTE: image data should be freed
}